

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fifo_cache.hpp
# Opt level: O2

void __thiscall
cappuccino::
fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::do_insert(fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
            *this,unsigned_long *key,
           basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  list<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
  *__x;
  uint in_EAX;
  _List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>
  _Var1;
  _Node_iterator<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>,_false,_false>
  *p_Var2;
  __off64_t *in_R8;
  size_t in_R9;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>,_false,_false>,_bool>
  pVar3;
  fifo_iterator last_element_position;
  
  __x = &this->m_fifo_list;
  std::__cxx11::
  list<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
  ::splice(__x,(int)__x,(__off64_t *)__x,
           (int)(this->m_fifo_list).
                super__List_base<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
                ._M_impl._M_node.super__List_node_base._M_next,in_R8,in_R9,in_EAX);
  _Var1 = std::
          prev<std::_List_iterator<cappuccino::fifo_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>
                    ((_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>
                      )__x,1);
  last_element_position._M_node = _Var1._M_node;
  if (*(char *)&_Var1._M_node[1]._M_prev == '\x01') {
    p_Var2 = std::
             optional<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>,_false,_false>_>
             ::value((optional<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>,_false,_false>_>
                      *)(_Var1._M_node + 1));
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>,_std::allocator<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&(this->m_keyed_elements)._M_h,
            (const_iterator)
            (p_Var2->
            super__Node_iterator_base<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>,_false>
            )._M_cur);
  }
  else {
    this->m_used_size = this->m_used_size + 1;
  }
  std::__cxx11::string::operator=((string *)(_Var1._M_node + 2),(string *)value);
  pVar3 = std::
          _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::_List_iterator<cappuccino::fifo_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>,std::allocator<std::pair<unsigned_long_const,std::_List_iterator<cappuccino::fifo_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::
          _M_emplace<unsigned_long_const&,std::_List_iterator<cappuccino::fifo_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::element>&>
                    ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::_List_iterator<cappuccino::fifo_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>,std::allocator<std::pair<unsigned_long_const,std::_List_iterator<cappuccino::fifo_cache<unsigned_long,std::__cxx11::string,(cappuccino::thread_safe)1>::element>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&this->m_keyed_elements,key,&last_element_position);
  if (*(char *)&_Var1._M_node[1]._M_prev == '\0') {
    *(undefined1 *)&_Var1._M_node[1]._M_prev = 1;
  }
  (((_Optional_base<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>,_false,_false>,_true,_true>
     *)&_Var1._M_node[1]._M_next)->_M_payload).
  super__Optional_payload_base<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>,_false,_false>_>
  ._M_payload = (_Storage<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>,_false,_false>,_true>
                 )pVar3.first.
                  super__Node_iterator_base<std::pair<const_unsigned_long,_std::_List_iterator<cappuccino::fifo_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>,_false>
                  ._M_cur;
  return;
}

Assistant:

auto do_insert(const key_type& key, value_type&& value) -> void
    {
        // Take the head item and replace it at the tail of the fifo list.
        m_fifo_list.splice(m_fifo_list.end(), m_fifo_list, m_fifo_list.begin());

        fifo_iterator last_element_position = std::prev(m_fifo_list.end());
        element&      e                     = *last_element_position;

        // since we 'deleted' the head item, if it has a value in the keyed data
        // structure it needs to be deleted first.
        if (e.m_keyed_position.has_value())
        {
            m_keyed_elements.erase(e.m_keyed_position.value());
        }
        else
        {
            // If the cache isn't 'full' increment its size.
            ++m_used_size;
        }

        e.m_value          = std::move(value);
        e.m_keyed_position = m_keyed_elements.emplace(key, last_element_position).first;
    }